

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreakOperator.cpp
# Opt level: O1

void __thiscall lts2::FreakOperator::initWithPatchSize(FreakOperator *this,Size *patchSize)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  IntegratingCell *pIVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint i_1;
  uint uVar9;
  uint *puVar10;
  uint ring;
  int i;
  long lVar11;
  float fVar12;
  double dVar13;
  float filterSigma [8];
  float ringRadius [8];
  float local_78 [8];
  float local_58 [8];
  Size local_38;
  
  local_38.width = patchSize->width;
  local_38.height = patchSize->height;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_38);
  iVar7 = (this->super_LBDOperator)._patchSize.width;
  iVar6 = (this->super_LBDOperator)._patchSize.height;
  if (iVar7 < iVar6) {
    iVar6 = iVar7;
  }
  local_58[0] = (float)(iVar6 / 0x19);
  fVar12 = ((float)iVar6 * 22.0) / 1575.0;
  local_58[1] = fVar12 + local_58[0];
  local_58[2] = fVar12 * 3.0 + local_58[0];
  local_58[3] = fVar12 * 6.0 + local_58[0];
  local_58[4] = fVar12 * 10.0 + local_58[0];
  local_58[5] = fVar12 * 15.0 + local_58[0];
  local_58[6] = fVar12 * 21.0 + local_58[0];
  local_58[7] = 0.0;
  local_78[0] = local_58[0] * 0.5;
  local_78[1] = local_58[1] * 0.5;
  local_78[2] = local_58[2] * 0.5;
  local_78[3] = local_58[3] * 0.5;
  local_78[4] = local_58[4] * 0.5;
  local_78[5] = local_58[5] * 0.5;
  local_78[6] = local_58[6] * 0.5;
  local_78[7] = local_58[0] / 3.0;
  lVar11 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ring[",5);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] = ",4);
    poVar3 = std::ostream::_M_insert<double>((double)local_58[lVar11]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    poVar3 = std::ostream::_M_insert<double>((double)local_78[lVar11]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  (this->super_LBDOperator)._patternPoints = 0x2b;
  pIVar4 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar4 != (IntegratingCell *)0x0) {
    operator_delete__(pIVar4);
  }
  pIVar4 = (IntegratingCell *)operator_new__((ulong)(this->super_LBDOperator)._patternPoints * 0x18)
  ;
  (this->super_LBDOperator)._sensitiveCells = pIVar4;
  puVar10 = FREAKS_CELLS_PER_RING;
  lVar11 = 0;
  do {
    uVar1 = *puVar10;
    dVar13 = (double)uVar1;
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,pIVar4,uVar1,local_78[lVar11],local_58[lVar11],
               (float)(6.283185307179586 / dVar13),
               (float)((double)(int)lVar11 * (3.141592653589793 / dVar13)));
    pIVar4 = pIVar4 + uVar1;
    lVar11 = lVar11 + 1;
    puVar10 = puVar10 + 1;
  } while (lVar11 != 8);
  uVar1 = (this->super_LBDOperator)._patternPoints;
  pvVar5 = operator_new__((ulong)((uVar1 - 1) * uVar1 >> 1) << 3);
  if (1 < uVar1) {
    uVar2 = 1;
    iVar7 = 0;
    do {
      uVar9 = 0;
      do {
        *(uint *)((long)pvVar5 + (ulong)(iVar7 + uVar9) * 8) = uVar9;
        *(uint *)((long)pvVar5 + (ulong)(iVar7 + uVar9) * 8 + 4) = uVar2;
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
      uVar2 = uVar2 + 1;
      iVar7 = iVar7 + uVar9;
    } while (uVar2 != uVar1);
  }
  if (*(int *)&(this->super_LBDOperator).super_LinearOperator.field_0xc != 0) {
    uVar8 = 0;
    do {
      (this->super_LBDOperator)._basisFunctions[uVar8] =
           *(BasisFunction *)((long)pvVar5 + (ulong)FREAKS_RANKED_PAIRS[uVar8 % 0x281] * 8);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc);
  }
  operator_delete__(pvVar5);
  return;
}

Assistant:

void lts2::FreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point

#ifdef DEBUG
    for (int i = 0; i < 8; ++i)
        std::cerr << "ring[" << i << "] = " << ringRadius[i] << " (" << filterSigma[i] << ")" << std::endl;
#endif

    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create the possible pairs
    lbd::BasisFunction* allPairs = new lbd::BasisFunction[_patternPoints*(_patternPoints-1)/2];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            allPairs[k].pos_cell = i;
            allPairs[k].neg_cell = j;
        }
    
    // Now, retain only the best ones
    for (unsigned int i = 0; i < _pairsInUse; ++i)
      _basisFunctions[i] = allPairs[ FREAKS_RANKED_PAIRS[i % lbd::kFreakTotalPairs] ];
    
    // Not needed anymore
    delete[] allPairs;
}